

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmffh(mcmcx1def *ctx,uchar *p)

{
  long lVar1;
  size_t sVar2;
  ushort *in_RSI;
  long *in_RDI;
  mcmodef *o;
  ushort *local_18;
  
  local_18 = in_RSI;
  while( true ) {
    if (*local_18 == 0xffff) {
      return (uchar *)0x0;
    }
    lVar1 = *(long *)(*in_RDI + (long)((int)(uint)*local_18 >> 8) * 8) +
            (long)(int)(*local_18 & 0xff) * 0x20;
    if ((*(ushort *)(lVar1 + 0x14) & 0x80) != 0) break;
    sVar2 = osrndsz(2);
    local_18 = (ushort *)(sVar2 + *(ushort *)(lVar1 + 0x18) + (long)local_18);
  }
  return (uchar *)local_18;
}

Assistant:

static uchar *mcmffh(mcmcx1def *ctx, uchar *p)
{
    mcmodef *o;

    MCMGLBCTX(ctx);

    while (*(mcmon *)p != MCMONINV)
    {
        o = mcmgobje(ctx, *(mcmon *)p);
        assert(o->mcmoptr == p + osrndsz(sizeof(mcmon)));
        if (o->mcmoflg & MCMOFFREE) return(p);
        p += osrndsz(sizeof(mcmon)) + o->mcmosiz;  /* move on to next chunk */
    }
    return((uchar *)0);                      /* no more free blocks in heap */
}